

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

int cvui::printf(char *__format,...)

{
  char in_AL;
  int iVar1;
  char *in_RCX;
  int in_EDX;
  int in_ESI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [32];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  allocator<char> local_59;
  String local_58;
  undefined4 local_38;
  undefined4 local_34;
  va_list aArgs;
  char *theFmt_local;
  int theY_local;
  int theX_local;
  Mat *theWhere_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  aArgs[0].overflow_arg_area = local_128;
  aArgs[0]._0_8_ = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x20;
  local_108 = in_R8;
  local_100 = in_R9;
  aArgs[0].reg_save_area = in_RCX;
  vsprintf(internal::gBuffer,in_RCX,&local_38);
  cv::Mat::operator=((Mat *)internal::gScreen,(Mat *)__format);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,internal::gBuffer,&local_59);
  internal::text((cvui_block_t *)internal::gScreen,in_ESI,in_EDX,&local_58,0.4,0xcecece,true);
  std::__cxx11::string::~string((string *)&local_58);
  iVar1 = std::allocator<char>::~allocator(&local_59);
  return iVar1;
}

Assistant:

void printf(cv::Mat& theWhere, int theX, int theY, const char *theFmt, ...) {
	va_list aArgs;

	va_start(aArgs, theFmt);
	vsprintf_s(internal::gBuffer, theFmt, aArgs);
	va_end(aArgs);

	internal::gScreen.where = theWhere;
	internal::text(internal::gScreen, theX, theY, internal::gBuffer, 0.4, 0xCECECE, true);
}